

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_file.cpp
# Opt level: O0

int write_sparse_end_chunk(output_file *out)

{
  int iVar1;
  long in_RDI;
  int ret;
  chunk_header_t chunk_header;
  undefined2 local_1c;
  undefined2 local_1a;
  undefined4 local_18;
  undefined4 local_14;
  long local_10;
  
  if (*(int *)(in_RDI + 0x20) != 0) {
    local_1c = 0xcac4;
    local_1a = 0;
    local_18 = 0;
    local_14 = 0x10;
    local_10 = in_RDI;
    iVar1 = (**(code **)(*(long *)(in_RDI + 0x10) + 0x18))(in_RDI,&local_1c,0xc);
    if (iVar1 < 0) {
      return iVar1;
    }
    (**(code **)(*(long *)(local_10 + 0x10) + 0x18))(local_10,local_10 + 0xc,4);
    if (iVar1 < 0) {
      return iVar1;
    }
    *(int *)(local_10 + 8) = *(int *)(local_10 + 8) + 1;
  }
  return 0;
}

Assistant:

int write_sparse_end_chunk(struct output_file* out) {
  chunk_header_t chunk_header;
  int ret;

  if (out->use_crc) {
    chunk_header.chunk_type = CHUNK_TYPE_CRC32;
    chunk_header.reserved1 = 0;
    chunk_header.chunk_sz = 0;
    chunk_header.total_sz = CHUNK_HEADER_LEN + 4;

    ret = out->ops->write(out, &chunk_header, sizeof(chunk_header));
    if (ret < 0) {
      return ret;
    }
    out->ops->write(out, &out->crc32, 4);
    if (ret < 0) {
      return ret;
    }

    out->chunk_cnt++;
  }

  return 0;
}